

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O0

value_type_conflict1
amrex::fudetail::ReduceMin_host<amrex::FArrayBox,amrex::FArrayBox,N_VMinQuotient_MultiFab::__0,void>
          (FabArray<amrex::FArrayBox> *fa1,FabArray<amrex::FArrayBox> *fa2,IntVect *nghost,
          anon_class_4_1_a856b79d *f)

{
  bool bVar1;
  double *pdVar2;
  Array4<const_double> *arr2;
  Array4<const_double> *arr1;
  Box *bx;
  MFIter mfi;
  value_type r;
  MFIter *in_stack_fffffffffffffe80;
  FabArray<amrex::FArrayBox> *this;
  undefined8 in_stack_fffffffffffffea0;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffffea8;
  MFIter *in_stack_fffffffffffffeb0;
  IntVect *in_stack_fffffffffffffeb8;
  MFIter *in_stack_fffffffffffffec0;
  Array4<const_double> *in_stack_fffffffffffffee8;
  Array4<const_double> *in_stack_fffffffffffffef0;
  Box *in_stack_fffffffffffffef8;
  undefined1 local_f8 [104];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  MFIter local_88;
  RefID local_28 [5];
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffffea0 >> 0x38);
  local_28[0].data = (BARef *)std::numeric_limits<double>::max();
  MFIter::MFIter(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(bool)do_tiling_);
  while( true ) {
    bVar1 = MFIter::isValid(&local_88);
    if (!bVar1) break;
    in_stack_fffffffffffffe80 = (MFIter *)(local_f8 + 0x4c);
    MFIter::growntilebox(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    this = (FabArray<amrex::FArrayBox> *)local_f8;
    local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_stack_fffffffffffffe80;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(this,in_stack_fffffffffffffe80);
    local_f8._64_8_ = this;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(this,in_stack_fffffffffffffe80);
    in_stack_fffffffffffffeb8 =
         (IntVect *)
         N_VMinQuotient_MultiFab::anon_class_4_1_a856b79d::operator()
                   ((anon_class_4_1_a856b79d *)&stack0xfffffffffffffec0,in_stack_fffffffffffffef8,
                    in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    pdVar2 = std::min<double>((double *)local_28,(double *)&stack0xfffffffffffffeb8);
    local_28[0].data = (BARef *)*pdVar2;
    MFIter::operator++(&local_88);
  }
  MFIter::~MFIter(in_stack_fffffffffffffe80);
  return (value_type_conflict1)local_28[0].data;
}

Assistant:

typename FAB1::value_type
ReduceMin_host (FabArray<FAB1> const& fa1, FabArray<FAB2> const& fa2,
                IntVect const& nghost, F&& f)
{
    using value_type = typename FAB1::value_type;
    value_type r = std::numeric_limits<value_type>::max();

#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(min:r)
#endif
    for (MFIter mfi(fa1,true); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(nghost);
        const auto& arr1 = fa1.const_array(mfi);
        const auto& arr2 = fa2.const_array(mfi);
        r = std::min(r, f(bx, arr1, arr2));
    }

    return r;
}